

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::EnumValueOptions::~EnumValueOptions(EnumValueOptions *this)

{
  LogMessage *other;
  void *pvVar1;
  LogMessage local_58;
  LogFinisher local_19;
  
  pvVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    pvVar1 = *(void **)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  if (pvVar1 != (void *)0x0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/descriptor.pb.cc"
               ,0x215c);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: GetArena() == nullptr: ");
    internal::LogFinisher::operator=(&local_19,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::~RepeatedPtrField
            (&this->uninterpreted_option_);
  internal::ExtensionSet::~ExtensionSet(&this->_extensions_);
  return;
}

Assistant:

EnumValueOptions::~EnumValueOptions() {
  // @@protoc_insertion_point(destructor:google.protobuf.EnumValueOptions)
  SharedDtor();
  _internal_metadata_.Delete<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}